

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator*=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  ulong uVar5;
  uint32_t *this_00;
  long in_FS_OFFSET;
  base_uint<256U> a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = a.pn;
  base_uint((base_uint<256U> *)this_00);
  lVar2 = 8;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar5 = 0;
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      uVar5 = (ulong)b->pn[lVar4] * (ulong)this->pn[lVar3] + uVar5 + this_00[lVar4];
      this_00[lVar4] = (uint32_t)uVar5;
      uVar5 = uVar5 >> 0x20;
    }
    lVar2 = lVar2 + -1;
    this_00 = this_00 + 1;
  }
  operator=(this,&a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator*=(const base_uint& b)
{
    base_uint<BITS> a;
    for (int j = 0; j < WIDTH; j++) {
        uint64_t carry = 0;
        for (int i = 0; i + j < WIDTH; i++) {
            uint64_t n = carry + a.pn[i + j] + (uint64_t)pn[j] * b.pn[i];
            a.pn[i + j] = n & 0xffffffff;
            carry = n >> 32;
        }
    }
    *this = a;
    return *this;
}